

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

exr_result_t validate_deep_data(exr_context_t f,exr_priv_part_t curpart)

{
  uint uVar1;
  exr_attr_chlist_t *peVar2;
  exr_attr_chlist_entry_t *peVar3;
  exr_result_t eVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  
  if ((curpart->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) {
    if (EXR_COMPRESSION_ZIPS < curpart->comp_type) {
      eVar4 = (*f->report_error)(f,0xe,"Invalid compression for deep data");
      return eVar4;
    }
    peVar2 = (curpart->channels->field_6).chlist;
    lVar5 = (long)peVar2->num_channels;
    if (0 < lVar5) {
      peVar3 = peVar2->entries;
      lVar7 = 0;
      do {
        uVar1 = *(uint *)(peVar3->reserved + lVar7 + 3);
        if (uVar1 != 1) {
          UNRECOVERED_JUMPTABLE = f->print_error;
          uVar6 = *(undefined8 *)(peVar3->reserved + lVar7 + -0xd);
          pcVar8 = "channel \'%s\': x subsampling factor is not 1 (%d) for a deep image";
LAB_001339d6:
          eVar4 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar8,uVar6,(ulong)uVar1,UNRECOVERED_JUMPTABLE);
          return eVar4;
        }
        uVar1 = *(uint *)(peVar3->reserved + lVar7 + 7);
        if (uVar1 != 1) {
          UNRECOVERED_JUMPTABLE = f->print_error;
          uVar6 = *(undefined8 *)(peVar3->reserved + lVar7 + -0xd);
          pcVar8 = "channel \'%s\': y subsampling factor is not 1 (%d) for a deep image";
          goto LAB_001339d6;
        }
        lVar7 = lVar7 + 0x20;
      } while (lVar5 * 0x20 != lVar7);
    }
  }
  return 0;
}

Assistant:

static exr_result_t
validate_deep_data (exr_context_t f, exr_priv_part_t curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_chlist_t* channels = curpart->channels->chlist;

        // none, rle, zips
        if (curpart->comp_type != EXR_COMPRESSION_NONE &&
            curpart->comp_type != EXR_COMPRESSION_RLE &&
            curpart->comp_type != EXR_COMPRESSION_ZIPS)
            return f->report_error (
                f, EXR_ERR_INVALID_ATTR, "Invalid compression for deep data");

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}